

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketImpl::receive(WebSocketImpl *this)

{
  bool bVar1;
  bool bVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *puVar6;
  AsyncIoStream *pAVar7;
  uchar *puVar8;
  Header *this_00;
  uint64_t size;
  Array<unsigned_char> *pAVar9;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
  *errorHandler;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar10;
  long in_RSI;
  ArrayPtr<unsigned_char> *pAVar11;
  ArrayPtr<unsigned_char> AVar12;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar13;
  byte local_2b9;
  ArrayPtr<unsigned_char> local_230;
  PromiseNode *local_218;
  Promise<unsigned_long> local_210;
  undefined1 local_200 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2197:17),_unsigned_long>
  promise;
  size_t remaining;
  Array<unsigned_char> local_1d0;
  uint64_t local_1b8;
  byte local_1b0 [4];
  byte local_1ac;
  undefined1 local_1a8 [8];
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
  handleMessage;
  undefined1 local_160 [4];
  Mask mask;
  Fault local_148;
  Fault f_2;
  Array<unsigned_char> *fragment_1;
  Array<unsigned_char> *__end4_1;
  Array<unsigned_char> *__begin4_1;
  Vector<kj::Array<unsigned_char>_> *__range4_1;
  Array<unsigned_char> *local_f0;
  Array<unsigned_char> *fragment;
  Array<unsigned_char> *__end4;
  Array<unsigned_char> *__begin4;
  Vector<kj::Array<unsigned_char>_> *__range4;
  size_t offset;
  size_t amountToAllocate;
  byte *payloadTarget;
  Array<unsigned_char> message;
  bool isFin;
  Fault f_1;
  Fault f;
  bool isData;
  byte opcode;
  size_t payloadLen;
  size_t local_70;
  Header *recvHeader;
  PropagateException local_48 [8];
  Promise<unsigned_long> local_40;
  ArrayPtr<unsigned_char> local_30;
  size_t local_20;
  size_t headerSize;
  WebSocketImpl *this_local;
  
  this_local = this;
  puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
  sVar4 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
  sVar4 = Header::headerSize(puVar3,sVar4);
  local_20 = sVar4;
  sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
  if (sVar5 < sVar4) {
    puVar3 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    puVar6 = Array<unsigned_char>::begin((Array<unsigned_char> *)(in_RSI + 0xb8));
    if (puVar3 != puVar6) {
      sVar4 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
      if (sVar4 != 0) {
        puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)(in_RSI + 0xb8));
        puVar6 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
        sVar4 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
        memmove(puVar3,puVar6,sVar4);
      }
      sVar4 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
      local_30 = Array<unsigned_char>::slice((Array<unsigned_char> *)(in_RSI + 0xb8),0,sVar4);
      *(uchar **)(in_RSI + 0xd0) = local_30.ptr;
      *(size_t *)(in_RSI + 0xd8) = local_30.size_;
    }
    pAVar7 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)(in_RSI + 8));
    puVar3 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    puVar6 = Array<unsigned_char>::end((Array<unsigned_char> *)(in_RSI + 0xb8));
    puVar8 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    (*(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream[1])
              (&local_40,pAVar7,puVar3,1,(long)puVar6 - (long)puVar8);
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::WebSocketImpl::receive()::_lambda(unsigned_long)_1_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)&local_40,local_48);
    Promise<unsigned_long>::~Promise(&local_40);
    pPVar10 = extraout_RDX;
  }
  else {
    this_00 = (Header *)ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    sVar4 = local_20;
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    AVar12 = ArrayPtr<unsigned_char>::slice((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0),sVar4,sVar5);
    payloadLen = (size_t)AVar12.ptr;
    *(size_t *)(in_RSI + 0xd0) = payloadLen;
    local_70 = AVar12.size_;
    *(size_t *)(in_RSI + 0xd8) = local_70;
    size = Header::getPayloadLen(this_00);
    f.exception._7_1_ = Header::getOpcode(this_00);
    bVar2 = f.exception._7_1_ < 8;
    if (f.exception._7_1_ == 0) {
      bVar1 = Vector<kj::Array<unsigned_char>_>::empty
                        ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  (&f_1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x82e,FAILED,"!fragments.empty()",
                   "\"unexpected continuation frame in WebSocket\"",
                   (char (*) [43])"unexpected continuation frame in WebSocket");
        _::Debug::Fault::fatal(&f_1);
      }
      f.exception._7_1_ = (byte)*(undefined4 *)(in_RSI + 0x90);
    }
    else if ((bVar2) &&
            (bVar1 = Vector<kj::Array<unsigned_char>_>::empty
                               ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98)), !bVar1)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                ((Fault *)&stack0xffffffffffffff68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x832,FAILED,"fragments.empty()","\"expected continuation frame in WebSocket\"",
                 (char (*) [41])0x669b1c);
      _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff68);
    }
    message.disposer._7_1_ = Header::isFin(this_00);
    Array<unsigned_char>::Array((Array<unsigned_char> *)&payloadTarget);
    if ((message.disposer._7_1_ & 1) == 0) {
      if (!bVar2) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                  (&local_148,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x853,FAILED,"isData","\"WebSocket control frame cannot be fragmented\"",
                   (char (*) [45])"WebSocket control frame cannot be fragmented");
        _::Debug::Fault::fatal(&local_148);
      }
      heapArray<unsigned_char>((Array<unsigned_char> *)local_160,size);
      Array<unsigned_char>::operator=
                ((Array<unsigned_char> *)&payloadTarget,(Array<unsigned_char> *)local_160);
      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_160);
      amountToAllocate = (size_t)Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget)
      ;
      bVar2 = Vector<kj::Array<unsigned_char>_>::empty
                        ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98));
      if (bVar2) {
        *(uint *)(in_RSI + 0x90) = (uint)f.exception._7_1_;
      }
    }
    else {
      local_2b9 = 0;
      if (f.exception._7_1_ == 1) {
        local_2b9 = message.disposer._7_1_;
      }
      offset = size + (local_2b9 & 1);
      if ((!bVar2) ||
         (bVar2 = Vector<kj::Array<unsigned_char>_>::empty
                            ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98)), bVar2)) {
        heapArray<unsigned_char>((Array<unsigned_char> *)&f_2,offset);
        Array<unsigned_char>::operator=
                  ((Array<unsigned_char> *)&payloadTarget,(Array<unsigned_char> *)&f_2);
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&f_2);
        amountToAllocate =
             (size_t)Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
      }
      else {
        __range4 = (Vector<kj::Array<unsigned_char>_> *)0x0;
        __begin4 = (Array<unsigned_char> *)(in_RSI + 0x98);
        __end4 = Vector<kj::Array<unsigned_char>_>::begin
                           ((Vector<kj::Array<unsigned_char>_> *)__begin4);
        fragment = Vector<kj::Array<unsigned_char>_>::end
                             ((Vector<kj::Array<unsigned_char>_> *)__begin4);
        for (; __end4 != fragment; __end4 = __end4 + 1) {
          local_f0 = __end4;
          sVar4 = Array<unsigned_char>::size(__end4);
          __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + sVar4);
        }
        heapArray<unsigned_char>
                  ((Array<unsigned_char> *)&__range4_1,(long)&(__range4->builder).ptr + offset);
        Array<unsigned_char>::operator=
                  ((Array<unsigned_char> *)&payloadTarget,(Array<unsigned_char> *)&__range4_1);
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&__range4_1);
        __range4 = (Vector<kj::Array<unsigned_char>_> *)0x0;
        __end4_1 = Vector<kj::Array<unsigned_char>_>::begin
                             ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98));
        pAVar9 = Vector<kj::Array<unsigned_char>_>::end
                           ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98));
        for (; __end4_1 != pAVar9; __end4_1 = __end4_1 + 1) {
          puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
          puVar3 = puVar3 + (long)__range4;
          puVar6 = Array<unsigned_char>::begin(__end4_1);
          sVar4 = Array<unsigned_char>::size(__end4_1);
          memcpy(puVar3,puVar6,sVar4);
          sVar4 = Array<unsigned_char>::size(__end4_1);
          __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + sVar4);
        }
        puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&payloadTarget);
        amountToAllocate = (size_t)(puVar3 + (long)__range4);
        Vector<kj::Array<unsigned_char>_>::clear
                  ((Vector<kj::Array<unsigned_char>_> *)(in_RSI + 0x98));
        *(undefined4 *)(in_RSI + 0x90) = 0;
      }
    }
    local_1b0 = (byte  [4])Header::getMask(this_00);
    local_1d0.size_._0_1_ = f.exception._7_1_;
    local_1d0.disposer = (ArrayDisposer *)amountToAllocate;
    local_1ac = message.disposer._7_1_ & 1;
    local_1b8 = size;
    handleMessage.param.disposer._4_4_ = (Mask)local_1b0;
    mvCapture<kj::(anonymous_namespace)::WebSocketImpl::receive()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::Array<unsigned_char>&>
              ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                *)local_1a8,(kj *)&payloadTarget,&local_1d0,(Type *)(ulong)(uint)local_1b0);
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
    sVar4 = amountToAllocate;
    if (sVar5 < size) {
      pAVar11 = (ArrayPtr<unsigned_char> *)(in_RSI + 0xd0);
      puVar3 = ArrayPtr<unsigned_char>::begin(pAVar11);
      sVar5 = ArrayPtr<unsigned_char>::size(pAVar11);
      memcpy((void *)sVar4,puVar3,sVar5);
      sVar4 = ArrayPtr<unsigned_char>::size(pAVar11);
      promise.super_PromiseBase.node.ptr = (PromiseNode *)(size - sVar4);
      pAVar7 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)(in_RSI + 8));
      sVar4 = amountToAllocate;
      sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(in_RSI + 0xd0));
      (*(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream[1])
                (&local_210,pAVar7,sVar4 + sVar5,promise.super_PromiseBase.node.ptr);
      local_218 = promise.super_PromiseBase.node.ptr;
      Promise<unsigned_long>::
      then<kj::(anonymous_namespace)::WebSocketImpl::receive()::_lambda(unsigned_long)_2_,kj::_::PropagateException>
                ((Promise<unsigned_long> *)local_200,(Type *)&local_210,
                 (PropagateException *)&local_218);
      Promise<unsigned_long>::~Promise(&local_210);
      ArrayPtr<unsigned_char>::ArrayPtr(&local_230,(void *)0x0);
      *(uchar **)(in_RSI + 0xd0) = local_230.ptr;
      *(size_t *)(in_RSI + 0xd8) = local_230.size_;
      errorHandler = mv<kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::receive()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::Array<unsigned_char>>>
                               ((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                                 *)local_1a8);
      Promise<void>::
      then<kj::CaptureByMove<kj::(anonymous_namespace)::WebSocketImpl::receive()::_lambda(kj::Array<unsigned_char>&&)_1_,kj::Array<unsigned_char>>,kj::_::PropagateException>
                ((Promise<void> *)this,
                 (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                  *)local_200,(PropagateException *)errorHandler);
      Promise<void>::~Promise((Promise<void> *)local_200);
    }
    else {
      pAVar11 = (ArrayPtr<unsigned_char> *)(in_RSI + 0xd0);
      puVar3 = ArrayPtr<unsigned_char>::begin(pAVar11);
      memcpy((void *)sVar4,puVar3,size);
      sVar4 = ArrayPtr<unsigned_char>::size(pAVar11);
      AVar12 = ArrayPtr<unsigned_char>::slice(pAVar11,size,sVar4);
      *(ArrayPtr<unsigned_char> *)(in_RSI + 0xd0) = AVar12;
      CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
      ::operator()<>((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                      *)this);
    }
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2144:9),_kj::Array<unsigned_char>_>
    ::~CaptureByMove((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:2144:9),_kj::Array<unsigned_char>_>
                      *)local_1a8);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&payloadTarget);
    pPVar10 = extraout_RDX_00;
  }
  PVar13.super_PromiseBase.node.ptr = pPVar10;
  PVar13.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar13.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
    size_t headerSize = Header::headerSize(recvData.begin(), recvData.size());

    if (headerSize > recvData.size()) {
      if (recvData.begin() != recvBuffer.begin()) {
        // Move existing data to front of buffer.
        if (recvData.size() > 0) {
          memmove(recvBuffer.begin(), recvData.begin(), recvData.size());
        }
        recvData = recvBuffer.slice(0, recvData.size());
      }

      return stream->tryRead(recvData.end(), 1, recvBuffer.end() - recvData.end())
          .then([this](size_t actual) -> kj::Promise<Message> {
        if (actual == 0) {
          if (recvData.size() > 0) {
            return KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in frame header");
          } else {
            // It's incorrect for the WebSocket to disconnect without sending `Close`.
            return KJ_EXCEPTION(DISCONNECTED,
                "WebSocket disconnected between frames without sending `Close`.");
          }
        }

        recvData = recvBuffer.slice(0, recvData.size() + actual);
        return receive();
      });
    }

    auto& recvHeader = *reinterpret_cast<Header*>(recvData.begin());

    recvData = recvData.slice(headerSize, recvData.size());

    size_t payloadLen = recvHeader.getPayloadLen();

    auto opcode = recvHeader.getOpcode();
    bool isData = opcode < OPCODE_FIRST_CONTROL;
    if (opcode == OPCODE_CONTINUATION) {
      KJ_REQUIRE(!fragments.empty(), "unexpected continuation frame in WebSocket");

      opcode = fragmentOpcode;
    } else if (isData) {
      KJ_REQUIRE(fragments.empty(), "expected continuation frame in WebSocket");
    }

    bool isFin = recvHeader.isFin();

    kj::Array<byte> message;           // space to allocate
    byte* payloadTarget;               // location into which to read payload (size is payloadLen)
    if (isFin) {
      // Add space for NUL terminator when allocating text message.
      size_t amountToAllocate = payloadLen + (opcode == OPCODE_TEXT && isFin);

      if (isData && !fragments.empty()) {
        // Final frame of a fragmented message. Gather the fragments.
        size_t offset = 0;
        for (auto& fragment: fragments) offset += fragment.size();
        message = kj::heapArray<byte>(offset + amountToAllocate);

        offset = 0;
        for (auto& fragment: fragments) {
          memcpy(message.begin() + offset, fragment.begin(), fragment.size());
          offset += fragment.size();
        }
        payloadTarget = message.begin() + offset;

        fragments.clear();
        fragmentOpcode = 0;
      } else {
        // Single-frame message.
        message = kj::heapArray<byte>(amountToAllocate);
        payloadTarget = message.begin();
      }
    } else {
      // Fragmented message, and this isn't the final fragment.
      KJ_REQUIRE(isData, "WebSocket control frame cannot be fragmented");

      message = kj::heapArray<byte>(payloadLen);
      payloadTarget = message.begin();
      if (fragments.empty()) {
        // This is the first fragment, so set the opcode.
        fragmentOpcode = opcode;
      }
    }

    Mask mask = recvHeader.getMask();

    auto handleMessage = kj::mvCapture(message,
        [this,opcode,payloadTarget,payloadLen,mask,isFin]
        (kj::Array<byte>&& message) -> kj::Promise<Message> {
      if (!mask.isZero()) {
        mask.apply(kj::arrayPtr(payloadTarget, payloadLen));
      }

      if (!isFin) {
        // Add fragment to the list and loop.
        fragments.add(kj::mv(message));
        return receive();
      }

      switch (opcode) {
        case OPCODE_CONTINUATION:
          // Shouldn't get here; handled above.
          KJ_UNREACHABLE;
        case OPCODE_TEXT:
          message.back() = '\0';
          return Message(kj::String(message.releaseAsChars()));
        case OPCODE_BINARY:
          return Message(message.releaseAsBytes());
        case OPCODE_CLOSE:
          if (message.size() < 2) {
            return Message(Close { 1005, nullptr });
          } else {
            uint16_t status = (static_cast<uint16_t>(message[0]) << 8)
                            | (static_cast<uint16_t>(message[1])     );
            return Message(Close {
              status, kj::heapString(message.slice(2, message.size()).asChars())
            });
          }
        case OPCODE_PING:
          // Send back a pong.
          queuePong(kj::mv(message));
          return receive();
        case OPCODE_PONG:
          // Unsolicited pong. Ignore.
          return receive();
        default:
          KJ_FAIL_REQUIRE("unknown WebSocket opcode", opcode);
      }
    });

    if (payloadLen <= recvData.size()) {
      // All data already received.
      memcpy(payloadTarget, recvData.begin(), payloadLen);
      recvData = recvData.slice(payloadLen, recvData.size());
      return handleMessage();
    } else {
      // Need to read more data.
      memcpy(payloadTarget, recvData.begin(), recvData.size());
      size_t remaining = payloadLen - recvData.size();
      auto promise = stream->tryRead(payloadTarget + recvData.size(), remaining, remaining)
          .then([remaining](size_t amount) {
        if (amount < remaining) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "WebSocket EOF in message"));
        }
      });
      recvData = nullptr;
      return promise.then(kj::mv(handleMessage));
    }
  }